

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

char * Io_BlifLoadFile(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  int RetValue;
  char *pContents;
  int nFileSize;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Io_BlifLoadFile(): The file is unavailable (absent or open).\n");
    pFileName_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    iVar1 = (int)lVar2;
    if (iVar1 == 0) {
      fclose(__stream);
      printf("Io_BlifLoadFile(): The file is empty.\n");
      pFileName_local = (char *)0x0;
    }
    else {
      pFileName_local = (char *)malloc((long)(iVar1 + 10));
      rewind(__stream);
      fread(pFileName_local,(long)iVar1,1,__stream);
      fclose(__stream);
      strcpy(pFileName_local + iVar1,"\n.end\n");
    }
  }
  return pFileName_local;
}

Assistant:

static char * Io_BlifLoadFile( char * pFileName )
{
    FILE * pFile;
    int nFileSize;
    char * pContents;
    int RetValue;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Io_BlifLoadFile(): The file is unavailable (absent or open).\n" );
        return NULL;
    }
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile ); 
    if ( nFileSize == 0 )
    {
        fclose( pFile );
        printf( "Io_BlifLoadFile(): The file is empty.\n" );
        return NULL;
    }
    pContents = ABC_ALLOC( char, nFileSize + 10 );
    rewind( pFile );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    fclose( pFile );
    // finish off the file with the spare .end line
    // some benchmarks suddenly break off without this line
    strcpy( pContents + nFileSize, "\n.end\n" );
    return pContents;
}